

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void ARGBSepiaRow_C(uint8_t *dst_argb,int width)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  if (0 < width) {
    lVar3 = 0;
    do {
      uVar5 = (uint)dst_argb[lVar3 * 4];
      bVar1 = dst_argb[lVar3 * 4 + 1];
      bVar2 = dst_argb[lVar3 * 4 + 2];
      uVar6 = ((uint)bVar2 + (uint)bVar2 * 8) * 5 + (uint)bVar1 * 0x58 + uVar5 * 0x16 >> 7;
      uVar4 = (uint)bVar2 * 0x32 + (uint)bVar1 * 0x62 + uVar5 * 0x18 >> 7;
      if (0xfe < uVar6) {
        uVar6 = 0xff;
      }
      dst_argb[lVar3 * 4] =
           (uint8_t)((uint)bVar2 * 0x23 +
                     (uint)bVar1 * 0x40 + (uint)bVar1 * 4 + uVar5 * 0x10 + (uint)dst_argb[lVar3 * 4]
                    >> 7);
      if (0xfe < uVar4) {
        uVar4 = 0xff;
      }
      dst_argb[lVar3 * 4 + 1] = (uint8_t)uVar6;
      dst_argb[lVar3 * 4 + 2] = (uint8_t)uVar4;
      lVar3 = lVar3 + 1;
    } while (width != (int)lVar3);
  }
  return;
}

Assistant:

void ARGBSepiaRow_C(uint8_t* dst_argb, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    int b = dst_argb[0];
    int g = dst_argb[1];
    int r = dst_argb[2];
    int sb = (b * 17 + g * 68 + r * 35) >> 7;
    int sg = (b * 22 + g * 88 + r * 45) >> 7;
    int sr = (b * 24 + g * 98 + r * 50) >> 7;
    // b does not over flow. a is preserved from original.
    dst_argb[0] = sb;
    dst_argb[1] = clamp255(sg);
    dst_argb[2] = clamp255(sr);
    dst_argb += 4;
  }
}